

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple-messages.c
# Opt level: O1

int main(void)

{
  char cVar1;
  uint b;
  int b_00;
  int a;
  size_t sVar2;
  int line;
  char *testcase;
  rtosc_arg_t rVar3;
  
  memset(buffer2,0xff,0x100);
  puts("#Suite 1:");
  sVar2 = rtosc_message(buffer,0x100,"/page/poge","TIF");
  assert_hex_eq(ref1,buffer,0x14,(long)(int)sVar2,"Build A Simple No Allocated Arguments Message",
                0x13);
  sVar2 = rtosc_message_length(buffer,0x100);
  assert_int_eq(0x14,(int)sVar2,"Check rtosc_message_length() On Message",0x15);
  b = rtosc_narguments(buffer);
  assert_int_eq(3,b,"Check rtosc_narguments() On Message",0x19);
  cVar1 = rtosc_type(buffer,0);
  assert_char_eq('T',cVar1,"Check Argument T",0x1b);
  cVar1 = rtosc_type(buffer,1);
  assert_char_eq('I',cVar1,"Check Argument I",0x1c);
  cVar1 = rtosc_type(buffer,2);
  assert_char_eq('F',cVar1,"Check Argument F",0x1d);
  puts("#Suite 2:");
  sVar2 = rtosc_message(buffer,0x100,"/testing","is",0x17,"this string");
  assert_hex_eq(ref2,buffer,0x20,(long)(int)sVar2,"Build A Simple With-Allocation Message",0x23);
  puts("#Suite 3: misc regression tests");
  rtosc_message(buffer,0x100,"/register","iis",2,0xd,"/amp-env/av");
  rVar3 = rtosc_argument(buffer,2);
  assert_str_eq("/amp-env/av",rVar3.s,"Verify Basic String Can Be Read",0x29);
  puts("#checking overflow semantics");
  sVar2 = rtosc_message(buffer,0x20,"/testing","is",0x17,"this string");
  assert_int_eq(0x20,(int)sVar2,"Build Non-Overflowing Message",0x2e);
  sVar2 = rtosc_message_length(buffer,0x100);
  assert_int_eq(0x20,(int)sVar2,"Check rtosc_message_length()",0x30);
  sVar2 = rtosc_message(buffer,0x1f,"/testing","is",0x17,"this string");
  assert_int_eq(0,(int)sVar2,"Build Overflowing Message",0x33);
  assert_int_eq(0,(int)buffer[0],"Verify Buffers Are Cleared When Message Overflows",0x35);
  sVar2 = rtosc_message_length(buffer,0x100);
  assert_int_eq(0,(int)sVar2,"Check rtosc_message_length()",0x37);
  puts("#Check Float Args");
  sVar2 = rtosc_message(buffer,0x20,"oscil/freq","f",0x40ca69ab80000000);
  assert_true((uint)((int)sVar2 != 0),"Build Simple Float Message",0x3d);
  rVar3 = rtosc_argument(buffer,0);
  assert_flt_eq(13523.34,rVar3.f,"Check Float Retrieval",0x3e);
  puts("#Check simple character retrevial");
  sVar2 = rtosc_message(buffer,0x100,"/test","cccc",0xde,0xad,0xbe,0xef);
  assert_true((uint)((int)sVar2 != 0),"Verify Message Can Be Built",0x44);
  rVar3 = rtosc_argument(buffer,0);
  assert_int_eq(0xde,rVar3.i,"Check First Char Argument",0x47);
  rVar3 = rtosc_argument(buffer,3);
  assert_int_eq(0xef,rVar3.i,"Check Last Char Argument",0x49);
  sVar2 = rtosc_message(buffer,0x100,"/b","c",7);
  assert_int_eq(0xc,(int)sVar2,"Build Min-Length Allocated Arg Message",0x4d);
  rVar3 = rtosc_argument(buffer + 1,0);
  assert_int_eq(7,rVar3.i,"Verify Arg Retrieval",0x4f);
  puts("#Check packed blobs");
  sVar2 = rtosc_message(buffer,0x100,"m","bb",4,buffer2,1,buffer2);
  assert_int_eq(0x18,(int)sVar2,"Build Packed Blob Message",0x54);
  rVar3 = rtosc_argument(buffer,0);
  assert_int_eq(4,rVar3.i,"Check First Blob Length",0x56);
  rVar3 = rtosc_argument(buffer,1);
  assert_int_eq(1,rVar3.i,"Check Second Blob Length",0x58);
  puts("#Check \"Ti\"");
  sVar2 = rtosc_message(buffer,0x100,"/testing","Ti",0x2a);
  b_00 = (int)sVar2;
  if (b_00 == 0x14) {
    assert_hex_eq("/testing",buffer,0x14,0x14,"\'i\' after \'T\' is still being appended",0x61);
    rVar3 = rtosc_argument(buffer,0);
    assert_int_eq((int)rVar3.T,1,"1st arg is boolean true",0x62);
    rVar3 = rtosc_argument(buffer,1);
    testcase = "2nd arg is integer 42";
    a = rVar3.i;
    b_00 = 0x2a;
    line = 99;
  }
  else {
    testcase = "correct buffer size";
    a = 0x15;
    line = 0x66;
  }
  assert_int_eq(a,b_00,testcase,line);
  printf("# %d test(s) failed out of %d (currently passing %f%% tests)\n",
         100.0 - ((double)global_err * 100.0) / (double)test_counter);
  return (uint)(global_err != 0);
}

Assistant:

int main()
{
    memset(buffer2, 0xff, sizeof(buffer2));

    printf("#Suite 1:\n");
    //Check the creation of a simple no arguments message
    int sz = rtosc_message(buffer, 256, "/page/poge", "TIF");
    assert_hex_eq(ref1, buffer, sizeof(ref1), sz,
            "Build A Simple No Allocated Arguments Message", __LINE__);
    assert_int_eq(sizeof(ref1), rtosc_message_length(buffer, 256),
            "Check rtosc_message_length() On Message", __LINE__);

    //Verify that it can be read properly
    assert_int_eq(3, rtosc_narguments(buffer),
            "Check rtosc_narguments() On Message", __LINE__);

    assert_char_eq('T', rtosc_type(buffer, 0), "Check Argument T", __LINE__);
    assert_char_eq('I', rtosc_type(buffer, 1), "Check Argument I", __LINE__);
    assert_char_eq('F', rtosc_type(buffer, 2), "Check Argument F", __LINE__);

    //Check the creation of a more complex message
    printf("#Suite 2:\n");
    sz = rtosc_message(buffer, 256, "/testing", "is", 23, "this string");
    assert_hex_eq(ref2, buffer, sizeof(ref2), sz,
            "Build A Simple With-Allocation Message", __LINE__);

    printf("#Suite 3: misc regression tests\n");
    //Verify that a string argument can be retrieved
    rtosc_message(buffer, 256, "/register", "iis", 2, 13, "/amp-env/av");
    assert_str_eq("/amp-env/av",rtosc_argument(buffer,2).s,
            "Verify Basic String Can Be Read", __LINE__);

    //Verify that buffer overflows will not occur
    printf("#checking overflow semantics\n");
    sz = rtosc_message(buffer, 32, "/testing", "is", 23, "this string");
    assert_int_eq(32, sz, "Build Non-Overflowing Message", __LINE__);
    assert_int_eq(32, rtosc_message_length(buffer,256),
            "Check rtosc_message_length()", __LINE__);

    sz = rtosc_message(buffer, 31, "/testing", "is", 23, "this string");
    assert_int_eq(0, sz, "Build Overflowing Message", __LINE__);
    assert_int_eq(0, *buffer,
            "Verify Buffers Are Cleared When Message Overflows", __LINE__);
    assert_int_eq(0, rtosc_message_length(buffer, 256),
            "Check rtosc_message_length()", __LINE__);

    //check simple float retrevial
    printf("#Check Float Args\n");
    float f = 13523.34;
    sz = rtosc_message(buffer, 32, "oscil/freq", "f", f);
    assert_true(sz != 0, "Build Simple Float Message", __LINE__);
    assert_flt_eq(f, rtosc_argument(buffer,0).f, "Check Float Retrieval", __LINE__);


    //Simple Char Ret
    printf("#Check simple character retrevial\n");
    sz = rtosc_message(buffer, 256, "/test", "cccc", 0xde,0xad,0xbe,0xef);
    assert_true(sz != 0, "Verify Message Can Be Built", __LINE__);

    assert_int_eq(0xde, rtosc_argument(buffer, 0).i,
            "Check First Char Argument", __LINE__);
    assert_int_eq(0xef, rtosc_argument(buffer, 3).i,
            "Check Last Char Argument", __LINE__);

    //Verify argument retrieval for short messages
    sz = rtosc_message(buffer, 256, "/b", "c", 7);
    assert_int_eq(12, sz, "Build Min-Length Allocated Arg Message", __LINE__);
    assert_int_eq(7, rtosc_argument(buffer+1, 0).i,
            "Verify Arg Retrieval", __LINE__);

    //Work on a recently found bug
    printf("#Check packed blobs\n");
    sz = rtosc_message(buffer, 256, "m", "bb", 4, buffer2, 1, buffer2);
    assert_int_eq(24, sz, "Build Packed Blob Message", __LINE__);
    assert_int_eq(4,rtosc_argument(buffer, 0).b.len,
            "Check First Blob Length", __LINE__);
    assert_int_eq(1,rtosc_argument(buffer, 1).b.len,
            "Check Second Blob Length", __LINE__);

    //Check that an integer after a boolean is still appended
    printf("#Check \"Ti\"\n");
    char ref3[] = "/tes""ting""\0\0\0\0"",Ti\0""\0\0\0\x2a";
    sz = rtosc_message(buffer, sizeof(buffer), "/testing", "Ti", 42);
    if(sizeof(ref3)-1 == sz)
    {
        assert_hex_eq(ref3, buffer, sizeof(ref3)-1, sz,
                "'i' after 'T' is still being appended", __LINE__);
        assert_int_eq(rtosc_argument(buffer, 0).T, 1, "1st arg is boolean true", __LINE__);
        assert_int_eq(rtosc_argument(buffer, 1).i, 42, "2nd arg is integer 42", __LINE__);
    }
    else {
        assert_int_eq(sizeof(ref3), sz, "correct buffer size", __LINE__);
    }

    return test_summary();
}